

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ValidateProto3OpenEnum_Test::
~ValidationErrorTest_ValidateProto3OpenEnum_Test
          (ValidationErrorTest_ValidateProto3OpenEnum_Test *this)

{
  ValidationErrorTest_ValidateProto3OpenEnum_Test *this_local;
  
  ~ValidationErrorTest_ValidateProto3OpenEnum_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ValidateProto3OpenEnum) {
  // Define an open enum in an editions file.
  const FileDescriptor* foo =
      BuildFile(R"pb(name: 'foo.proto'
                     package: 'foo'
                     syntax: 'editions'
                     edition: EDITION_2023
                     enum_type {
                       name: 'FooEnum'
                       value { name: 'DEFAULT_OPTION' number: 0 }
                     })pb");
  const EnumDescriptor* enm = foo->enum_type(0);
  ASSERT_NE(enm, nullptr);

  const FileDescriptor* bar = BuildFile(
      R"pb(name: 'bar.proto'
           dependency: 'foo.proto'
           syntax: 'proto3'
           message_type {
             name: 'Foo'
             field {
               name: 'bar'
               number: 1
               label: LABEL_OPTIONAL
               type: TYPE_ENUM
               type_name: 'foo.FooEnum'
             }
           })pb");
  ASSERT_NE(bar, nullptr);

  EXPECT_EQ(bar->message_type(0)->field(0)->enum_type(), enm);
}